

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O1

string * GetTargetPropertyOrDefault
                   (string *__return_storage_ptr__,cmGeneratorTarget *target,string *property,
                   string *defaultValue)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  cmValue cVar4;
  
  cVar4 = cmGeneratorTarget::GetProperty(target,property);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (cVar4.Value == (string *)0x0) {
    pcVar2 = (defaultValue->_M_dataplus)._M_p;
    paVar1 = &defaultValue->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar1) {
      uVar3 = *(undefined8 *)((long)&defaultValue->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = defaultValue->_M_string_length;
    (defaultValue->_M_dataplus)._M_p = (pointer)paVar1;
    defaultValue->_M_string_length = 0;
    (defaultValue->field_2)._M_local_buf[0] = '\0';
  }
  else {
    pcVar2 = ((cVar4.Value)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (cVar4.Value)->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GetTargetPropertyOrDefault(cmGeneratorTarget const* target,
                                              std::string const& property,
                                              std::string defaultValue)
{
  if (cmValue name = target->GetProperty(property)) {
    return *name;
  }
  return defaultValue;
}